

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_NtkNodeNumFunc(Au_Ntk_t *p,int Func)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if ((p->pMan == (Au_Man_t *)0x0) || (p->pMan->pFuncs == (Abc_Nam_t *)0x0)) {
    iVar1 = (p->vObjs).nSize;
    if (0 < (long)iVar1) {
      uVar5 = (p->vObjs).nSize;
      lVar6 = 0;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      iVar4 = 0;
      do {
        if (uVar5 <= iVar1 - 1U) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = (p->vObjs).pArray[lVar6];
        uVar3 = *(ulong *)((long)(p->vPages).pArray[(int)uVar2 >> 0xc] +
                          (ulong)((uVar2 & 0xfff) << 4));
        iVar4 = iVar4 + (uint)(((uint)uVar3 & 0x3fffffff) == Func && (~uVar3 & 0x700000000) == 0);
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

int Au_NtkNodeNumFunc( Au_Ntk_t * p, int Func )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pMan && p->pMan->pFuncs )
        return 0;
    Au_NtkForEachNode( p, pObj, i )
    {
        Counter += (pObj->Func == (unsigned)Func);
//        printf( "%d ", pObj->Func );
    }
//    printf( "\n" );
    return Counter;
}